

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O2

void __thiscall glslang::TProgram::TProgram(TProgram *this)

{
  long lVar1;
  bool *pbVar2;
  TPoolAllocator *this_00;
  TInfoSink *this_01;
  long lVar3;
  
  this->_vptr_TProgram = (_func_int **)&PTR__TProgram_0089a2b0;
  lVar3 = 0;
  do {
    lVar1 = (long)&this->stages[0].
                   super__List_base<glslang::TShader_*,_std::allocator<glslang::TShader_*>_>._M_impl
                   ._M_node.super__List_node_base._M_next + lVar3;
    *(long *)((long)&this->stages[0].
                     super__List_base<glslang::TShader_*,_std::allocator<glslang::TShader_*>_>.
                     _M_impl._M_node.super__List_node_base._M_prev + lVar3) = lVar1;
    *(long *)((long)&this->stages[0].
                     super__List_base<glslang::TShader_*,_std::allocator<glslang::TShader_*>_>.
                     _M_impl._M_node.super__List_node_base._M_next + lVar3) = lVar1;
    *(undefined8 *)
     ((long)&this->stages[0].
             super__List_base<glslang::TShader_*,_std::allocator<glslang::TShader_*>_>._M_impl.
             _M_node._M_size + lVar3) = 0;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x150);
  this->reflection = (TReflection *)0x0;
  this->linked = false;
  this_00 = (TPoolAllocator *)::operator_new(0x60);
  TPoolAllocator::TPoolAllocator(this_00,0x2000,0x10);
  this->pool = this_00;
  this_01 = (TInfoSink *)::operator_new(0x60);
  TInfoSink::TInfoSink(this_01);
  this->infoSink = this_01;
  for (lVar3 = -0xe; lVar3 != 0; lVar3 = lVar3 + 1) {
    pbVar2 = this->newedIntermediate + lVar3 * 8;
    pbVar2[0] = false;
    pbVar2[1] = false;
    pbVar2[2] = false;
    pbVar2[3] = false;
    pbVar2[4] = false;
    pbVar2[5] = false;
    pbVar2[6] = false;
    pbVar2[7] = false;
    this->newedIntermediate[lVar3 + 0xe] = false;
  }
  return;
}

Assistant:

TProgram::TProgram() : reflection(nullptr), linked(false)
{
    pool = new TPoolAllocator;
    infoSink = new TInfoSink;
    for (int s = 0; s < EShLangCount; ++s) {
        intermediate[s] = nullptr;
        newedIntermediate[s] = false;
    }
}